

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O1

uint64_t chatter::platform::NetToHost64(uint64_t *net)

{
  ulong uVar1;
  
  uVar1 = *net;
  return uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
}

Assistant:

uint64_t NetToHost64(const uint64_t& net)
{
    int x = 1;
    if (*(char*)&x == x)
        /* little endian */
        return ((((uint64_t)ntohl(net)) << 32) + ntohl(net >> 32));

    else
        return net;
}